

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsGetNullValue(JsValueRef *nullValue)

{
  JsErrorCode JVar1;
  JsValueRef *local_10;
  JsValueRef *nullValue_local;
  
  local_10 = nullValue;
  JVar1 = ContextAPINoScriptWrapper_NoRecord<JsGetNullValue::__0>
                    ((anon_class_8_1_533fbeca)&local_10,true,false);
  return JVar1;
}

Assistant:

CHAKRA_API JsGetNullValue(_Out_ JsValueRef *nullValue)
{
    return ContextAPINoScriptWrapper_NoRecord([&] (Js::ScriptContext *scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(nullValue);

        *nullValue = scriptContext->GetLibrary()->GetNull();

        return JsNoError;
    },
    /*allowInObjectBeforeCollectCallback*/true);
}